

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall QFileSystemModel::fetchMore(QFileSystemModel *this,QModelIndex *parent)

{
  QFileSystemModelPrivate *this_00;
  QFileInfoGatherer *this_01;
  QFileSystemNode *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  if (this_00->setRootPath == true) {
    pQVar1 = QFileSystemModelPrivate::node(this_00,parent);
    if (pQVar1->populatedChildren == false) {
      pQVar1->populatedChildren = true;
      this_01 = (this_00->fileInfoGatherer)._M_t.
                super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>.
                _M_t.
                super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
      filePath((QString *)&local_40,this,parent);
      QFileInfoGatherer::list((QFileInfoGatherer *)this_01,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::fetchMore(const QModelIndex &parent)
{
    Q_D(QFileSystemModel);
    if (!d->setRootPath)
        return;
    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    if (indexNode->populatedChildren)
        return;
    indexNode->populatedChildren = true;
#if QT_CONFIG(filesystemwatcher)
    d->fileInfoGatherer->list(filePath(parent));
#endif
}